

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_draw.cxx
# Opt level: O2

void gl_draw(char *str,int n)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  unsigned_short local_4e;
  uint local_4c;
  char *local_48;
  XFontStruct *font;
  ulong local_38;
  
  local_48 = str;
  local_4c = fl_utf8toUtf16(str,n,gl_draw::buf,gl_draw::l);
  if (gl_draw::l <= (int)local_4c) {
    gl_draw::buf = (unsigned_short *)realloc(gl_draw::buf,(ulong)local_4c * 2 + 2);
    gl_draw::l = local_4c + 1;
    local_4c = fl_utf8toUtf16(local_48,n,gl_draw::buf,local_4c + 1);
  }
  uVar2 = 0;
  local_38 = 0;
  if (0 < (int)local_4c) {
    local_38 = (ulong)local_4c;
  }
  for (; uVar2 != local_38; uVar2 = uVar2 + 1) {
    uVar3 = (uint)(int)local_48[uVar2] >> 10 & 0x3f;
    if (gl_fontsize->glok[uVar3] == '\0') {
      gl_fontsize->glok[uVar3] = '\x01';
      uVar3 = uVar3 << 10;
      iVar1 = 0x400;
      while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
        font = (XFontStruct *)0x0;
        fl_XGetUtf8FontAndGlyph(gl_fontsize->font,uVar3,&font,&local_4e);
        if (font != (XFontStruct *)0x0) {
          glXUseXFont(font->fid,local_4e,1,gl_fontsize->listbase + uVar3);
        }
        uVar3 = uVar3 + 1;
      }
    }
  }
  glCallLists(local_4c,0x1403,gl_draw::buf);
  return;
}

Assistant:

void gl_draw(const char* str, int n) {
#ifdef __APPLE__  
  gl_draw_textures(str, n);
#else
  static xchar *buf = NULL;
  static int l = 0;
  int wn = fl_utf8toUtf16(str, n, (unsigned short*)buf, l);
  if(wn >= l) {
    buf = (xchar*) realloc(buf, sizeof(xchar) * (wn + 1));
    l = wn + 1;
    wn = fl_utf8toUtf16(str, n, (unsigned short*)buf, l);
  }
  n = wn;

  int i;
  for (i = 0; i < n; i++) {
    unsigned int r;
    r = (str[i] & 0xFC00) >> 10;
    if (!gl_fontsize->glok[r]) get_list(r);
  }
  glCallLists(n, GL_UNSIGNED_SHORT, buf);
#endif
}